

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
(anonymous_namespace)::PeerManagerImpl::FetchBlock_abi_cxx11_
          (PeerManagerImpl *this,NodeId peer_id,CBlockIndex *block_index)

{
  initializer_list<CInv> __l;
  optional<long> from_peer;
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  long in_FS_OFFSET;
  bool success;
  uint256 *hash;
  vector<CInv,_std::allocator<CInv>_> invs;
  PeerRef peer;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock38;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  anon_class_16_2_3fe1505d *in_stack_fffffffffffffde0;
  BlockManager *in_stack_fffffffffffffde8;
  char *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  PeerManagerImpl *in_stack_fffffffffffffe08;
  allocator_type *in_stack_fffffffffffffe10;
  PeerManagerImpl *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  NodeId in_stack_fffffffffffffe28;
  function<bool_(CNode_*)> *func;
  undefined1 *id;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 *flag;
  undefined4 in_stack_fffffffffffffe4c;
  int source_line;
  iterator **in_stack_fffffffffffffe68;
  CBlockIndex *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  _Storage<long,_true> in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  ConstevalFormatString<2U> fmt;
  undefined1 *puVar4;
  char *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea4 [12];
  NodeId in_stack_fffffffffffffee8;
  function<bool_(CNode_*)> local_e1;
  optional<long> local_b0 [2];
  undefined4 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  _Base_ptr local_8;
  
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  bVar1 = ::node::BlockManager::LoadingBlocks(in_stack_fffffffffffffde8);
  if (bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional<const_char_(&)[19],_true>
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffde8,(char (*) [19])in_stack_fffffffffffffde0);
  }
  else {
    anon_unknown.dwarf_1b21075::PeerManagerImpl::GetPeerRef
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe28);
    bVar1 = std::operator==((shared_ptr<(anonymous_namespace)::Peer> *)in_stack_fffffffffffffde8,
                            in_stack_fffffffffffffde0);
    if (bVar1) {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<const_char_(&)[20],_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffde8,(char (*) [20])in_stack_fffffffffffffde0);
    }
    else {
      std::
      __shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffde8);
      bVar1 = anon_unknown.dwarf_1b21075::CanServeWitnesses
                        ((Peer *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      source_line = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe4c);
      if (bVar1) {
        MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                  ((AnnotatedMixin<std::recursive_mutex> *)
                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe18,
                   (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe10,
                   (char *)in_stack_fffffffffffffe08,
                   (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                   in_stack_fffffffffffffdfc,SUB41((uint)in_stack_fffffffffffffdf8 >> 0x18,0));
        flag = &stack0xffffffffffffffd8;
        CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffde8);
        std::optional<long>::optional(local_b0);
        from_peer.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._8_8_ = in_stack_fffffffffffffe88;
        from_peer.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_payload._M_value = in_stack_fffffffffffffe80._M_value;
        anon_unknown.dwarf_1b21075::PeerManagerImpl::RemoveBlockRequest
                  (in_stack_fffffffffffffe18,(uint256 *)in_stack_fffffffffffffe10,from_peer);
        uVar2 = anon_unknown.dwarf_1b21075::PeerManagerImpl::BlockRequested
                          ((PeerManagerImpl *)
                           CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                           in_stack_fffffffffffffee8,in_stack_fffffffffffffe70,
                           in_stack_fffffffffffffe68);
        if ((bool)uVar2) {
          id = &stack0xffffffffffffffb8;
          CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffffde8);
          puVar4 = id;
          CInv::CInv((CInv *)in_stack_fffffffffffffde8,
                     (uint32_t)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                     (uint256 *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          fmt.fmt = (char *)0x1;
          func = &local_e1;
          std::allocator<CInv>::allocator
                    ((allocator<CInv> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          __l._M_array._7_1_ = in_stack_fffffffffffffe27;
          __l._M_array._0_7_ = in_stack_fffffffffffffe20;
          __l._M_len = (size_type)func;
          std::vector<CInv,_std::allocator<CInv>_>::vector
                    ((vector<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffe18,__l,
                     in_stack_fffffffffffffe10);
          std::allocator<CInv>::~allocator
                    ((allocator<CInv> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          std::function<bool(CNode*)>::
          function<(anonymous_namespace)::PeerManagerImpl::FetchBlock[abi:cxx11](long,CBlockIndex_const&)::__0,void>
                    ((function<bool_(CNode_*)> *)in_stack_fffffffffffffde8,in_stack_fffffffffffffde0
                    );
          bVar3 = CConnman::ForNode((CConnman *)CONCAT17(uVar2,in_stack_fffffffffffffe38),(NodeId)id
                                    ,func);
          std::function<bool_(CNode_*)>::~function
                    ((function<bool_(CNode_*)> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          if ((bVar3 & 1) == 0) {
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional<const_char_(&)[25],_true>
                      ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffde8,(char (*) [25])in_stack_fffffffffffffde0);
          }
          else {
            bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8
                                                ),Trace);
            if (bVar1) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         in_stack_fffffffffffffdf0);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                         in_stack_fffffffffffffdf0);
              base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffde0);
              in_stack_fffffffffffffde8 = (BlockManager *)&stack0xffffffffffffff70;
              in_stack_fffffffffffffdd8 = 1;
              logging_function._4_12_ = in_stack_fffffffffffffea4;
              logging_function._M_len._0_4_ = in_stack_fffffffffffffea0;
              source_file._M_str = in_stack_fffffffffffffe98;
              source_file._M_len = (size_t)puVar4;
              LogPrintFormatInternal<std::__cxx11::string,long>
                        (logging_function,source_file,source_line,(LogFlags)flag,
                         in_stack_ffffffffffffff80,fmt,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff90,(long *)in_stack_ffffffffffffff98);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            }
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::optional(in_RDI);
          }
          std::vector<CInv,_std::allocator<CInv>_>::~vector
                    ((vector<CInv,_std::allocator<CInv>_> *)in_stack_fffffffffffffde8);
        }
        else {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::optional<const_char_(&)[33],_true>
                    ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffffde8,(char (*) [33])in_stack_fffffffffffffde0);
        }
        UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
                   CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      }
      else {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<const_char_(&)[16],_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffde8,(char (*) [16])in_stack_fffffffffffffde0);
      }
    }
    std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
              ((shared_ptr<(anonymous_namespace)::Peer> *)
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  }
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::optional<std::string> PeerManagerImpl::FetchBlock(NodeId peer_id, const CBlockIndex& block_index)
{
    if (m_chainman.m_blockman.LoadingBlocks()) return "Loading blocks ...";

    // Ensure this peer exists and hasn't been disconnected
    PeerRef peer = GetPeerRef(peer_id);
    if (peer == nullptr) return "Peer does not exist";

    // Ignore pre-segwit peers
    if (!CanServeWitnesses(*peer)) return "Pre-SegWit peer";

    LOCK(cs_main);

    // Forget about all prior requests
    RemoveBlockRequest(block_index.GetBlockHash(), std::nullopt);

    // Mark block as in-flight
    if (!BlockRequested(peer_id, block_index)) return "Already requested from this peer";

    // Construct message to request the block
    const uint256& hash{block_index.GetBlockHash()};
    std::vector<CInv> invs{CInv(MSG_BLOCK | MSG_WITNESS_FLAG, hash)};

    // Send block request message to the peer
    bool success = m_connman.ForNode(peer_id, [this, &invs](CNode* node) {
        this->MakeAndPushMessage(*node, NetMsgType::GETDATA, invs);
        return true;
    });

    if (!success) return "Peer not fully connected";

    LogDebug(BCLog::NET, "Requesting block %s from peer=%d\n",
                 hash.ToString(), peer_id);
    return std::nullopt;
}